

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureCubeLodControlCase::init
          (TextureCubeLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  uint size;
  long lVar1;
  int iVar2;
  TextureCube *this_00;
  ulong uVar3;
  ulong extraout_RAX;
  int levelNdx;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  RGBA local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  Vec4 local_40;
  
  size = this->m_texSize;
  if (size == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (size != 0) {
      for (; size >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube(this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,size)
  ;
  this->m_texture = this_00;
  uVar3 = (ulong)(0x20 - uVar6);
  uVar5 = 0;
  local_48 = uVar3;
  do {
    if (uVar5 == 6) {
      return (int)uVar3;
    }
    local_58 = uVar5 & 0xffffffff;
    uVar3 = uVar5 * 0x18;
    lVar7 = 0;
    local_50 = uVar3;
    for (uVar4 = 0; local_48 != uVar4; uVar4 = uVar4 + 1) {
      if ((CubeFace)uVar5 < CUBEFACE_LAST) {
        iVar2 = (*(code *)(&DAT_018411a0 + *(int *)(&DAT_018411a0 + local_58 * 4)))();
        return iVar2;
      }
      tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar5,(int)uVar4);
      lVar1 = *(long *)((long)&(this->m_texture->m_refTexture).m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_50);
      local_5c.m_value = 0xff000000;
      tcu::RGBA::toVec(&local_5c);
      tcu::clear((PixelBufferAccess *)(lVar1 + lVar7),&local_40);
      lVar7 = lVar7 + 0x28;
      uVar3 = extraout_RAX;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void TextureCubeLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	const int		numLevels	= deLog2Floor32(m_texSize)+1;

	m_texture = new glu::TextureCube(m_context.getRenderContext(), format, m_texSize);

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}